

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O3

int Io_WriteMoPlaOneM(FILE *pFile,Abc_Ntk_t *pNtk,int nMints)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  undefined8 *__ptr;
  DdNode *bFunc;
  DdManager *dd;
  uint *__ptr_00;
  void *pvVar5;
  undefined8 uVar6;
  DdNode *pDVar7;
  ulong uVar8;
  int iVar9;
  char *__s;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    if (pNtk->ntkType != ABC_NTK_LOGIC) {
      return 1;
    }
    if (pNtk->ntkFunc != ABC_FUNC_BDD) {
      return 1;
    }
    if (0 < pNtk->vCos->nSize) {
      if (((DdManager *)pNtk->pManFunc)->size == pNtk->vCis->nSize) {
        plVar3 = (long *)*pNtk->vCos->pArray;
        Io_WriteMoPlaOneIntMintermsM
                  (pFile,pNtk,(DdManager *)pNtk->pManFunc,
                   *(DdNode **)
                    (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8) + 0x38),nMints);
        return 1;
      }
      puts("Cannot write minterms because the size of the manager for local BDDs is not equal to");
      puts("the number of primary inputs. (It is likely that the current network is not collapsed.)"
          );
      return 1;
    }
LAB_00347d6e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    return 0;
  }
  pVVar10 = pNtk->vCos;
  uVar1 = pVVar10->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = (ulong)uVar1;
  }
  __ptr_00[1] = 0;
  if ((int)uVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar8 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar5;
  if ((int)uVar1 < 1) goto LAB_00347d6e;
  lVar11 = 0;
  do {
    lVar13 = lVar11;
    lVar11 = *(long *)(*pVVar10->pArray[lVar13] + 0x1b0);
    if (*(int *)(lVar11 + 4) < 8) goto LAB_00347d6e;
    piVar4 = *(int **)(*(long *)(lVar11 + 8) + 0x38);
    pvVar5 = *(void **)(piVar4 + 2);
    if (pvVar5 == (void *)0x0) {
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar9 = (int)*(long *)((long)pVVar10->pArray[lVar13] + 0x10);
    lVar11 = (long)iVar9;
    iVar2 = *piVar4;
    if (iVar2 <= iVar9) {
      iVar14 = iVar9 + 10;
      if (iVar9 < iVar2 * 2) {
        iVar14 = iVar2 * 2;
      }
      if (iVar2 < iVar14) {
        pvVar5 = realloc(pvVar5,(long)iVar14 * 8);
        *(void **)(piVar4 + 2) = pvVar5;
        memset((void *)((long)*piVar4 * 8 + (long)pvVar5),0,((long)iVar14 - (long)*piVar4) * 8);
        *piVar4 = iVar14;
      }
    }
    lVar12 = *(long *)((long)pvVar5 + lVar11 * 8);
    if (lVar12 == 0) {
      if (*(code **)(piVar4 + 8) == (code *)0x0) {
        lVar12 = 0;
      }
      else {
        uVar6 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
        *(undefined8 *)(*(long *)(piVar4 + 2) + lVar11 * 8) = uVar6;
        lVar12 = *(long *)(*(long *)(piVar4 + 2) + lVar11 * 8);
      }
    }
    iVar9 = (int)uVar8;
    if ((int)lVar13 == iVar9) {
      if (iVar9 < 0x10) {
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar5 = malloc(0x80);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr_00 + 2),0x80);
        }
        *(void **)(__ptr_00 + 2) = pvVar5;
        *__ptr_00 = 0x10;
        uVar8 = 0x10;
      }
      else {
        uVar8 = (ulong)(uint)(iVar9 * 2);
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar5 = malloc(uVar8 * 8);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr_00 + 2),uVar8 * 8);
        }
        *(void **)(__ptr_00 + 2) = pvVar5;
        *__ptr_00 = iVar9 * 2;
      }
    }
    else {
      pvVar5 = *(void **)(__ptr_00 + 2);
    }
    lVar11 = lVar13 + 1;
    __ptr_00[1] = (uint)lVar11;
    *(long *)((long)pvVar5 + lVar13 * 8) = lVar12;
    pVVar10 = pNtk->vCos;
  } while (lVar11 < pVVar10->nSize);
  __ptr = *(undefined8 **)(__ptr_00 + 2);
  bFunc = (DdNode *)*__ptr;
  pDVar7 = Cudd_ReadOne(dd);
  if (bFunc == pDVar7) {
    __s = "First primary output has constant 1 function.";
  }
  else {
    pDVar7 = Cudd_ReadOne(dd);
    if (pDVar7 != (DdNode *)((ulong)bFunc ^ 1)) {
      Io_WriteMoPlaOneIntMintermsM(pFile,pNtk,dd,bFunc,nMints);
      goto LAB_00347d13;
    }
    __s = "First primary output has constant 0 function.";
  }
  puts(__s);
LAB_00347d13:
  Abc_NtkFreeGlobalBdds(pNtk,0);
  lVar11 = -1;
  do {
    Cudd_RecursiveDeref(dd,(DdNode *)__ptr[lVar11 + 1]);
    lVar11 = lVar11 + 1;
  } while (lVar13 != lVar11);
  free(__ptr);
  free(__ptr_00);
  Cudd_Quit(dd);
  return 1;
}

Assistant:

int Io_WriteMoPlaOneM( FILE * pFile, Abc_Ntk_t * pNtk, int nMints )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkIsStrash(pNtk) )
    {
        assert( Abc_NtkIsStrash(pNtk) );
        dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
        if ( dd == NULL )
            return 0;
        if ( fVerbose )
            printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

        // complement the global functions
        vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

        // get the output function
        bFunc = (DdNode *)Vec_PtrEntry(vFuncsGlob, 0);
        if ( bFunc == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 1 function.\n" );
        else if ( Cudd_Not(bFunc) == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 0 function.\n" );
        else
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        Abc_NtkFreeGlobalBdds( pNtk, 0 );

        // cleanup
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, bFunc );
        Vec_PtrFree( vFuncsGlob );
        //Extra_StopManager( dd );
        Cudd_Quit( dd );
    }
    else if ( Abc_NtkIsBddLogic(pNtk) )
    {
        DdNode * bFunc = (DdNode *)Abc_ObjFanin0(Abc_NtkCo(pNtk, 0))->pData;
        dd = (DdManager *)pNtk->pManFunc;
        if ( dd->size == Abc_NtkCiNum(pNtk) )
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        else
        {
            printf( "Cannot write minterms because the size of the manager for local BDDs is not equal to\n" );
            printf( "the number of primary inputs. (It is likely that the current network is not collapsed.)\n" );
        }
    }
    return 1;
}